

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O1

char * __thiscall CommandOptions::szPictureRate(CommandOptions *this)

{
  ui32_t uVar1;
  
  uVar1 = this->picture_rate;
  if ((int)uVar1 < 0x32) {
    switch(uVar1) {
    case 0x10:
      return "16";
    case 0x11:
    case 0x13:
    case 0x15:
    case 0x18:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
      break;
    case 0x12:
      return "18.182";
    case 0x14:
      return "20";
    case 0x16:
      return "21.818";
    case 0x17:
      return "23.976";
    case 0x19:
      return "25";
    case 0x1e:
      return "30";
    default:
      if (uVar1 == 0x30) {
        return "48";
      }
    }
  }
  else if ((int)uVar1 < 0x78) {
    if ((int)uVar1 < 0x60) {
      if (uVar1 == 0x32) {
        return "50";
      }
      if (uVar1 == 0x3c) {
        return "60";
      }
    }
    else {
      if (uVar1 == 0x60) {
        return "96";
      }
      if (uVar1 == 100) {
        return "100";
      }
    }
  }
  else if ((int)uVar1 < 200) {
    if (uVar1 == 0x78) {
      return "120";
    }
    if (uVar1 == 0xc0) {
      return "192";
    }
  }
  else {
    if (uVar1 == 200) {
      return "200";
    }
    if (uVar1 == 0xf0) {
      return "240";
    }
  }
  return "24";
}

Assistant:

const char* szPictureRate()
  {
    if ( picture_rate == 16 ) return "16";
    if ( picture_rate == 18 ) return "18.182";
    if ( picture_rate == 20 ) return "20";
    if ( picture_rate == 22 ) return "21.818";
    if ( picture_rate == 23 ) return "23.976";
    if ( picture_rate == 24 ) return "24";
    if ( picture_rate == 25 ) return "25";
    if ( picture_rate == 30 ) return "30";
    if ( picture_rate == 48 ) return "48";
    if ( picture_rate == 50 ) return "50";
    if ( picture_rate == 60 ) return "60";
    if ( picture_rate == 96 ) return "96";
    if ( picture_rate == 100 ) return "100";
    if ( picture_rate == 120 ) return "120";
    if ( picture_rate == 192 ) return "192";
    if ( picture_rate == 200 ) return "200";
    if ( picture_rate == 240 ) return "240";
    return "24";
  }